

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::redirect(ClientImpl *this,Request *req,Response *res,Error *error)

{
  bool bVar1;
  __type_conflict _Var2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  const_reference pvVar7;
  allocator<char> local_461;
  string local_460;
  undefined1 local_440 [8];
  ClientImpl cli;
  undefined1 local_148 [4];
  int next_port;
  string_type next_path;
  string_type port_str;
  undefined1 local_e8 [8];
  string_type next_host;
  string_type next_scheme;
  char *scheme;
  smatch m;
  string local_70;
  undefined1 local_50 [8];
  string location;
  Error *error_local;
  Response *res_local;
  Request *req_local;
  ClientImpl *this_local;
  
  if (req->redirect_count_ == 0) {
    *error = ExceedRedirectCount;
    this_local._7_1_ = false;
  }
  else {
    location.field_2._8_8_ = error;
    Response::get_header_value_abi_cxx11_(&local_70,res,"location",0);
    detail::decode_url((string *)local_50,&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if ((redirect(httplib::Request&,httplib::Response&,httplib::Error&)::re_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&redirect(httplib::Request&,httplib::Response&,httplib::Error&)
                                       ::re_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&redirect(httplib::Request&,httplib::Response&,httplib::Error&)::re_abi_cxx11_,
                   "(?:(https?):)?(?://(?:\\[([\\d:]+)\\]|([^:/?#]+))(?::(\\d+))?)?([^?#]*(?:\\?[^#]*)?)(?:#.*)?"
                   ,0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &redirect(httplib::Request&,httplib::Response&,httplib::Error&)::re_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&redirect(httplib::Request&,httplib::Response&,httplib::Error&)::
                             re_abi_cxx11_);
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&scheme);
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)&scheme,
                         &redirect(httplib::Request&,httplib::Response&,httplib::Error&)::
                          re_abi_cxx11_,0);
      if (bVar1) {
        uVar4 = (*this->_vptr_ClientImpl[6])();
        pcVar6 = "http";
        if ((uVar4 & 1) != 0) {
          pcVar6 = "https";
        }
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,1);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)((long)&next_host.field_2 + 8),pvVar7);
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,2);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)local_e8,pvVar7);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          pvVar7 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&scheme,3);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str((string_type *)((long)&port_str.field_2 + 8),pvVar7);
          std::__cxx11::string::operator=
                    ((string *)local_e8,(string *)(port_str.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(port_str.field_2._M_local_buf + 8));
        }
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,4);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)((long)&next_path.field_2 + 8),pvVar7);
        pvVar7 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&scheme,5);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)local_148,pvVar7);
        cli.logger_._M_invoker._4_4_ = this->port_;
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          cli.logger_._M_invoker._4_4_ =
               std::__cxx11::stoi((string *)((long)&next_path.field_2 + 8),(size_t *)0x0,10);
        }
        else {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&next_host.field_2 + 8),"https");
            cli.logger_._M_invoker._4_4_ = 0x50;
            if (bVar1) {
              cli.logger_._M_invoker._4_4_ = 0x1bb;
            }
          }
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=((string *)(next_host.field_2._M_local_buf + 8),pcVar6);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=((string *)local_e8,(string *)&this->host_);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=((string *)local_148,"/");
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&next_host.field_2 + 8),pcVar6);
        if (((bVar1) &&
            (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_e8,&this->host_), _Var2)) &&
           (cli.logger_._M_invoker._4_4_ == this->port_)) {
          this_local._7_1_ =
               detail::redirect<httplib::ClientImpl>
                         (this,req,res,(string *)local_148,(string *)local_50,
                          (Error *)location.field_2._8_8_);
          m._M_begin._M_current._0_4_ = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&next_host.field_2 + 8),"https");
          if (bVar1) {
            this_local._7_1_ = false;
            m._M_begin._M_current._0_4_ = 1;
          }
          else {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_460,pcVar6,&local_461);
            ClientImpl((ClientImpl *)local_440,&local_460,cli.logger_._M_invoker._4_4_);
            std::__cxx11::string::~string((string *)&local_460);
            std::allocator<char>::~allocator(&local_461);
            copy_settings((ClientImpl *)local_440,this);
            this_local._7_1_ =
                 detail::redirect<httplib::ClientImpl>
                           ((ClientImpl *)local_440,req,res,(string *)local_148,(string *)local_50,
                            (Error *)location.field_2._8_8_);
            m._M_begin._M_current._0_4_ = 1;
            ~ClientImpl((ClientImpl *)local_440);
          }
        }
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::~string((string *)(next_path.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)(next_host.field_2._M_local_buf + 8));
      }
      else {
        this_local._7_1_ = false;
        m._M_begin._M_current._0_4_ = 1;
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&scheme);
    }
    else {
      this_local._7_1_ = false;
      m._M_begin._M_current._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

inline bool ClientImpl::redirect(Request &req, Response &res, Error &error) {
  if (req.redirect_count_ == 0) {
    error = Error::ExceedRedirectCount;
    return false;
  }

  auto location = detail::decode_url(res.get_header_value("location"), true);
  if (location.empty()) { return false; }

  const static std::regex re(
      R"((?:(https?):)?(?://(?:\[([\d:]+)\]|([^:/?#]+))(?::(\d+))?)?([^?#]*(?:\?[^#]*)?)(?:#.*)?)");

  std::smatch m;
  if (!std::regex_match(location, m, re)) { return false; }

  auto scheme = is_ssl() ? "https" : "http";

  auto next_scheme = m[1].str();
  auto next_host = m[2].str();
  if (next_host.empty()) { next_host = m[3].str(); }
  auto port_str = m[4].str();
  auto next_path = m[5].str();

  auto next_port = port_;
  if (!port_str.empty()) {
    next_port = std::stoi(port_str);
  } else if (!next_scheme.empty()) {
    next_port = next_scheme == "https" ? 443 : 80;
  }

  if (next_scheme.empty()) { next_scheme = scheme; }
  if (next_host.empty()) { next_host = host_; }
  if (next_path.empty()) { next_path = "/"; }

  if (next_scheme == scheme && next_host == host_ && next_port == port_) {
    return detail::redirect(*this, req, res, next_path, location, error);
  } else {
    if (next_scheme == "https") {
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
      SSLClient cli(next_host.c_str(), next_port);
      cli.copy_settings(*this);
      if (ca_cert_store_) { cli.set_ca_cert_store(ca_cert_store_); }
      return detail::redirect(cli, req, res, next_path, location, error);
#else
      return false;
#endif
    } else {
      ClientImpl cli(next_host.c_str(), next_port);
      cli.copy_settings(*this);
      return detail::redirect(cli, req, res, next_path, location, error);
    }
  }
}